

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void highbd_masked_variance4xh
               (uint16_t *src_ptr,int src_stride,uint16_t *a_ptr,uint16_t *b_ptr,uint8_t *m_ptr,
               int m_stride,int height,int *sse,int *sum_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined4 *in_R8;
  int in_R9D;
  int iVar14;
  int iVar15;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar16 [16];
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  __m128i data_l;
  __m128i m_inv;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i zero;
  __m128i round_const;
  __m128i mask_max;
  __m128i sum_sq;
  __m128i sum;
  int y;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined1 local_4c8 [16];
  int local_4b0;
  undefined4 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_488;
  byte local_438;
  byte bStack_437;
  byte bStack_436;
  byte bStack_435;
  byte bStack_434;
  byte bStack_433;
  byte bStack_432;
  byte bStack_431;
  undefined4 local_358;
  undefined4 local_338;
  ushort uStack_2d6;
  ushort uStack_2d4;
  ushort uStack_2d2;
  ushort uStack_2ce;
  ushort uStack_2cc;
  ushort uStack_2ca;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  ushort local_158;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_134;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  ushort uStack_cc;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  __m128i prod;
  __m128i tmp;
  __m128i diff_r;
  __m128i diff_l;
  __m128i src_r;
  __m128i src_l;
  __m128i pred_r;
  
  local_4c8 = ZEXT816(0);
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_4a8 = in_R8;
  local_4a0 = in_RCX;
  local_498 = in_RDX;
  local_488 = in_RDI;
  for (local_4b0 = 0; local_4b0 < (int)mask_r[1]; local_4b0 = local_4b0 + 2) {
    uVar1 = *local_488;
    uVar2 = *(undefined8 *)((long)local_488 + (long)in_ESI * 2);
    uVar5 = *local_498;
    uVar6 = local_498[1];
    uVar7 = *local_4a0;
    uVar8 = local_4a0[1];
    uVar3 = *local_4a8;
    uVar4 = *(undefined4 *)((long)local_4a8 + (long)in_R9D);
    local_438 = (byte)uVar3;
    bStack_437 = (byte)((uint)uVar3 >> 8);
    bStack_436 = (byte)((uint)uVar3 >> 0x10);
    bStack_435 = (byte)((uint)uVar3 >> 0x18);
    bStack_434 = (byte)uVar4;
    bStack_433 = (byte)((uint)uVar4 >> 8);
    bStack_432 = (byte)((uint)uVar4 >> 0x10);
    bStack_431 = (byte)((uint)uVar4 >> 0x18);
    uStack_2d6 = (ushort)bStack_437;
    uStack_2d4 = (ushort)bStack_436;
    uStack_2d2 = (ushort)bStack_435;
    uStack_2ce = (ushort)bStack_433;
    uStack_2cc = (ushort)bStack_432;
    uStack_2ca = (ushort)bStack_431;
    local_118 = (undefined2)uVar5;
    uStack_116 = (undefined2)((ulong)uVar5 >> 0x10);
    uStack_114 = (undefined2)((ulong)uVar5 >> 0x20);
    uStack_112 = (undefined2)((ulong)uVar5 >> 0x30);
    local_128 = (undefined2)uVar7;
    uStack_126 = (undefined2)((ulong)uVar7 >> 0x10);
    uStack_124 = (undefined2)((ulong)uVar7 >> 0x20);
    uStack_122 = (undefined2)((ulong)uVar7 >> 0x30);
    auVar23[1] = 0;
    auVar23[0] = local_438;
    uStack_134 = CONCAT11(0,bStack_436);
    auVar11._2_2_ = local_128;
    auVar11._0_2_ = local_118;
    auVar11._4_2_ = uStack_116;
    auVar11._6_2_ = uStack_126;
    auVar11._10_2_ = uStack_124;
    auVar11._8_2_ = uStack_114;
    auVar11._12_2_ = uStack_112;
    auVar11._14_2_ = uStack_122;
    auVar23._2_2_ = 0x40 - (ushort)local_438;
    auVar23[4] = bStack_437;
    auVar23[5] = 0;
    auVar23._6_2_ = 0x40 - uStack_2d6;
    auVar23._10_2_ = 0x40 - uStack_2d4;
    auVar23._8_2_ = uStack_134;
    auVar23[0xc] = bStack_435;
    auVar23[0xd] = 0;
    auVar23._14_2_ = 0x40 - uStack_2d2;
    auVar16 = pmaddwd(auVar11,auVar23);
    local_228 = auVar16._0_4_;
    iStack_224 = auVar16._4_4_;
    iStack_220 = auVar16._8_4_;
    iStack_21c = auVar16._12_4_;
    auVar23 = ZEXT416(6);
    uStack_b0 = (undefined2)uVar6;
    uStack_ae = (undefined2)((ulong)uVar6 >> 0x10);
    uStack_ac = (undefined2)((ulong)uVar6 >> 0x20);
    uStack_aa = (undefined2)((ulong)uVar6 >> 0x30);
    uStack_c0 = (undefined2)uVar8;
    uStack_be = (undefined2)((ulong)uVar8 >> 0x10);
    uStack_bc = (undefined2)((ulong)uVar8 >> 0x20);
    uStack_ba = (undefined2)((ulong)uVar8 >> 0x30);
    auVar9[1] = 0;
    auVar9[0] = bStack_434;
    uStack_cc = CONCAT11(0,bStack_432);
    auVar10._2_2_ = uStack_c0;
    auVar10._0_2_ = uStack_b0;
    auVar10._4_2_ = uStack_ae;
    auVar10._6_2_ = uStack_be;
    auVar10._10_2_ = uStack_bc;
    auVar10._8_2_ = uStack_ac;
    auVar10._12_2_ = uStack_aa;
    auVar10._14_2_ = uStack_ba;
    auVar9._2_2_ = 0x40 - (ushort)bStack_434;
    auVar9[4] = bStack_433;
    auVar9[5] = 0;
    auVar9._6_2_ = 0x40 - uStack_2ce;
    auVar9._10_2_ = 0x40 - uStack_2cc;
    auVar9._8_2_ = uStack_cc;
    auVar9[0xc] = bStack_431;
    auVar9[0xd] = 0;
    auVar9._14_2_ = 0x40 - uStack_2ca;
    auVar16 = pmaddwd(auVar10,auVar9);
    local_248 = auVar16._0_4_;
    iStack_244 = auVar16._4_4_;
    iStack_240 = auVar16._8_4_;
    iStack_23c = auVar16._12_4_;
    auVar16 = ZEXT416(6);
    local_158 = (ushort)uVar1;
    uStack_156 = (ushort)((ulong)uVar1 >> 0x10);
    uStack_154 = (ushort)((ulong)uVar1 >> 0x20);
    uStack_152 = (ushort)((ulong)uVar1 >> 0x30);
    uStack_f0 = (ushort)uVar2;
    uStack_ee = (ushort)((ulong)uVar2 >> 0x10);
    uStack_ec = (ushort)((ulong)uVar2 >> 0x20);
    uStack_ea = (ushort)((ulong)uVar2 >> 0x30);
    src_r[1]._6_2_ = 0;
    src_r[1]._4_2_ = uStack_156;
    src_l[0]._6_2_ = 0;
    src_l[0]._4_2_ = uStack_152;
    iVar14 = (local_228 + 0x20 >> auVar23) - (uint)local_158;
    iVar17 = (iStack_224 + 0x20 >> auVar23) - src_r[1]._4_4_;
    iVar19 = (iStack_220 + 0x20 >> auVar23) - (uint)uStack_154;
    iVar21 = (iStack_21c + 0x20 >> auVar23) - src_l[0]._4_4_;
    diff_r[1]._6_2_ = 0;
    diff_r[1]._4_2_ = uStack_ee;
    diff_l[0]._6_2_ = 0;
    diff_l[0]._4_2_ = uStack_ea;
    iVar15 = (local_248 + 0x20 >> auVar16) - (uint)uStack_f0;
    iVar18 = (iStack_244 + 0x20 >> auVar16) - diff_r[1]._4_4_;
    iVar20 = (iStack_240 + 0x20 >> auVar16) - (uint)uStack_ec;
    iVar22 = (iStack_23c + 0x20 >> auVar16) - diff_l[0]._4_4_;
    local_288 = local_4c8._0_4_;
    iStack_284 = local_4c8._4_4_;
    iStack_280 = local_4c8._8_4_;
    iStack_27c = local_4c8._12_4_;
    local_4c8._4_4_ = iStack_284 + iVar17 + iVar18;
    local_4c8._0_4_ = local_288 + iVar14 + iVar15;
    local_4c8._8_4_ = iStack_280 + iVar19 + iVar20;
    local_4c8._12_4_ = iStack_27c + iVar21 + iVar22;
    auVar13._4_4_ = iVar17;
    auVar13._0_4_ = iVar14;
    auVar13._12_4_ = iVar21;
    auVar13._8_4_ = iVar19;
    auVar12._4_4_ = iVar18;
    auVar12._0_4_ = iVar15;
    auVar12._12_4_ = iVar22;
    auVar12._8_4_ = iVar20;
    auVar16 = packssdw(auVar13,auVar12);
    auVar16 = pmaddwd(auVar16,auVar16);
    local_2a8 = (int)local_4d8;
    iStack_2a4 = (int)((ulong)local_4d8 >> 0x20);
    iStack_2a0 = (int)uStack_4d0;
    iStack_29c = (int)((ulong)uStack_4d0 >> 0x20);
    local_2b8 = auVar16._0_4_;
    iStack_2b4 = auVar16._4_4_;
    iStack_2b0 = auVar16._8_4_;
    iStack_2ac = auVar16._12_4_;
    local_4d8 = CONCAT44(iStack_2a4 + iStack_2b4,local_2a8 + local_2b8);
    uStack_4d0 = CONCAT44(iStack_29c + iStack_2ac,iStack_2a0 + iStack_2b0);
    local_488 = (undefined8 *)((long)local_488 + (long)(in_ESI << 1) * 2);
    local_498 = local_498 + 2;
    local_4a0 = local_4a0 + 2;
    local_4a8 = (undefined4 *)((long)local_4a8 + (long)(in_R9D << 1));
  }
  auVar16._8_8_ = uStack_4d0;
  auVar16._0_8_ = local_4d8;
  auVar16 = phaddd(local_4c8,auVar16);
  auVar16 = phaddd(auVar16,ZEXT816(0));
  local_338 = auVar16._0_4_;
  *(undefined4 *)data_r[1] = local_338;
  local_358 = auVar16._4_4_;
  *(undefined4 *)data_r[0] = local_358;
  return;
}

Assistant:

static void highbd_masked_variance4xh(const uint16_t *src_ptr, int src_stride,
                                      const uint16_t *a_ptr,
                                      const uint16_t *b_ptr,
                                      const uint8_t *m_ptr, int m_stride,
                                      int height, int *sse, int *sum_) {
  int y;
  // Note: For this function, h <= 8 (or maybe 16 if we add 4:1 partitions).
  // So the maximum value of sum is (2^12 - 1) * 4 * 16 =~ 2^18
  // and the maximum value of sum_sq is (2^12 - 1)^2 * 4 * 16 =~ 2^30.
  // So we can safely pack sum_sq into 32-bit fields, which is slightly more
  // convenient.
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();

  for (y = 0; y < height; y += 2) {
    __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a = _mm_loadu_si128((const __m128i *)a_ptr);
    const __m128i b = _mm_loadu_si128((const __m128i *)b_ptr);
    const __m128i m = _mm_unpacklo_epi8(
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(const int *)m_ptr),
                           _mm_cvtsi32_si128(*(const int *)&m_ptr[m_stride])),
        zero);
    const __m128i m_inv = _mm_sub_epi16(mask_max, m);

    const __m128i data_l = _mm_unpacklo_epi16(a, b);
    const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
    __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
    pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i data_r = _mm_unpackhi_epi16(a, b);
    const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
    __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
    pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i src_l = _mm_unpacklo_epi16(src, zero);
    const __m128i src_r = _mm_unpackhi_epi16(src, zero);
    __m128i diff_l = _mm_sub_epi32(pred_l, src_l);
    __m128i diff_r = _mm_sub_epi32(pred_r, src_r);

    // Update partial sums and partial sums of squares
    sum = _mm_add_epi32(sum, _mm_add_epi32(diff_l, diff_r));
    const __m128i tmp = _mm_packs_epi32(diff_l, diff_r);
    const __m128i prod = _mm_madd_epi16(tmp, tmp);
    sum_sq = _mm_add_epi32(sum_sq, prod);

    src_ptr += src_stride * 2;
    a_ptr += 8;
    b_ptr += 8;
    m_ptr += m_stride * 2;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, zero);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}